

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

int StateDiscardPileSize(pyhanabi_state_t *state)

{
  vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_> *this;
  size_type sVar1;
  long *in_RDI;
  
  if (in_RDI == (long *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x188,"int StateDiscardPileSize(pyhanabi_state_t *)");
  }
  if (*in_RDI != 0) {
    this = hanabi_learning_env::HanabiState::DiscardPile((HanabiState *)*in_RDI);
    sVar1 = std::
            vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
            ::size(this);
    return (int)sVar1;
  }
  __assert_fail("state->state != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0x189,"int StateDiscardPileSize(pyhanabi_state_t *)");
}

Assistant:

int StateDiscardPileSize(pyhanabi_state_t* state) {
  REQUIRE(state != nullptr);
  REQUIRE(state->state != nullptr);
  return reinterpret_cast<hanabi_learning_env::HanabiState*>(state->state)
      ->DiscardPile()
      .size();
}